

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O3

iterator __thiscall JetHead::list<ComponentManager::ClassInfo_*>::iterator::erase(iterator *this)

{
  Node *pNVar1;
  Node *pNVar2;
  undefined8 *in_RSI;
  Node *pNVar3;
  
  pNVar3 = (Node *)*in_RSI;
  if (pNVar3 == (Node *)0x0) {
    pNVar3 = (Node *)0x0;
  }
  else {
    pNVar1 = pNVar3->next;
    if ((pNVar1 != (Node *)0x0) && (pNVar2 = pNVar3->prev, pNVar2 != (Node *)0x0)) {
      pNVar2->next = pNVar1;
      pNVar1->prev = pNVar2;
      operator_delete(pNVar3,0x18);
      *in_RSI = 0;
      pNVar3 = pNVar1;
    }
  }
  this->mNode = pNVar3;
  return (iterator)(Node *)this;
}

Assistant:

iterator erase()
			{
				// Don't segfault, and don't delete head or tail
				// placeholder nodes 
				if (mNode == NULL or 
					mNode->next == NULL or 
					mNode->prev == NULL) 
				{
					return *this;
				}

				Node* prev = mNode->prev;
				Node* next = mNode->next;

				prev->next = next;
				next->prev = prev;

				delete mNode;
				mNode = NULL;

				iterator ret;
				ret.mNode = next;
				return ret;
			}